

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O0

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinPKZB_C,void>::
eval_exc_<int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinPKZB_C,_void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  bool bVar1;
  const_host_buffer_type in_RCX;
  const_host_buffer_type in_RDX;
  const_host_buffer_type in_RSI;
  BuiltinKernel *in_RDI;
  host_buffer_type in_R8;
  int unaff_retaddr;
  
  bVar1 = BuiltinKernel::is_polarized(in_RDI);
  if (bVar1) {
    host_eval_exc_helper_polar<ExchCXX::BuiltinPKZB_C>
              (this._4_4_,(const_host_buffer_type)args,(const_host_buffer_type)args_1,
               (const_host_buffer_type)args_2,(const_host_buffer_type)args_3,
               (host_buffer_type)args_4);
  }
  else {
    host_eval_exc_helper_unpolar<ExchCXX::BuiltinPKZB_C>
              (unaff_retaddr,(const_host_buffer_type)in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return;
}

Assistant:

void eval_exc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }